

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O1

MATRIX mat_mul(MATRIX A,MATRIX B)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  MATRIX ppdVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  
  ppdVar6 = mat_creat(*(int *)(A + -1),*(int *)((long)B + -4),-1);
  if (ppdVar6 == (MATRIX)0x0) {
    ppdVar6 = (MATRIX)0x0;
  }
  else {
    iVar1 = *(int *)(A + -1);
    if (0 < (long)iVar1) {
      uVar2 = *(uint *)((long)B + -4);
      lVar7 = 0;
      do {
        if (0 < (int)uVar2) {
          pdVar4 = ppdVar6[lVar7];
          uVar3 = *(uint *)((long)A + -4);
          uVar8 = 0;
          do {
            pdVar4[uVar8] = 0.0;
            if (0 < (int)uVar3) {
              pdVar5 = A[lVar7];
              dVar10 = pdVar4[uVar8];
              uVar9 = 0;
              do {
                dVar10 = dVar10 + pdVar5[uVar9] * B[uVar9][uVar8];
                pdVar4[uVar8] = dVar10;
                uVar9 = uVar9 + 1;
              } while (uVar3 != uVar9);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar2);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar1);
    }
  }
  return ppdVar6;
}

Assistant:

MATRIX mat_mul( MATRIX A, MATRIX B )
{
	int	i, j, k;
	MATRIX	C;

	if ((C = mat_creat( MatRow(A), MatCol(B), UNDEFINED )) == NULL)
		return (NULL);

	for (i=0; i<MatRow(A); i++)
	for (j=0; j<MatCol(B); j++)
	for (k=0, C[i][j]=0.0; k<MatCol(A); k++)
		{
		C[i][j] += A[i][k] * B[k][j];
		}
	return (C);
}